

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O2

void Gia_ManNormalizeEquivalences(Gia_Man_t *p,int *pReprs)

{
  uint uVar1;
  Gia_Rpr_t *pGVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                  ,0x109,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
  }
  if (p->pNexts == (int *)0x0) {
    iVar5 = p->nObjs;
    pGVar2 = (Gia_Rpr_t *)calloc((long)iVar5,4);
    p->pReprs = pGVar2;
    for (lVar3 = 0; lVar3 < iVar5; lVar3 = lVar3 + 1) {
      p->pReprs[lVar3] = (Gia_Rpr_t)((uint)p->pReprs[lVar3] | 0xfffffff);
      iVar5 = p->nObjs;
    }
    lVar3 = 0;
    do {
      if (iVar5 <= lVar3) {
        piVar4 = Gia_ManDeriveNexts(p);
        p->pNexts = piVar4;
        return;
      }
      if (pReprs[lVar3] != -1) {
        uVar1 = Gia_ManFindRepr_rec(pReprs,(int)lVar3);
        if (lVar3 <= (int)uVar1 && uVar1 != 0xfffffff) {
          __assert_fail("Num == GIA_VOID || Num < Id",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
        }
        p->pReprs[lVar3] = (Gia_Rpr_t)((uint)p->pReprs[lVar3] & 0xf0000000 | uVar1 & 0xfffffff);
        iVar5 = p->nObjs;
      }
      lVar3 = lVar3 + 1;
    } while( true );
  }
  __assert_fail("p->pNexts == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                ,0x10a,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
}

Assistant:

void Gia_ManNormalizeEquivalences( Gia_Man_t * p, int * pReprs )
{
    int i, iRepr;
    assert( p->pReprs == NULL );
    assert( p->pNexts == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( pReprs[i] == ~0 )
            continue;
        iRepr = Gia_ManFindRepr_rec( pReprs, i );
        Gia_ObjSetRepr( p, i, iRepr );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
}